

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

Variable __thiscall LiteScript::_Type_ARRAY::OArray(_Type_ARRAY *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  Object *pOVar2;
  Type *pTVar3;
  Number *this_00;
  Array *pAVar4;
  Variable *in_RCX;
  uint *puVar5;
  uint *extraout_RDX;
  Variable VVar6;
  String local_48;
  Variable *local_28;
  Variable *obj2_local;
  Variable *obj1_local;
  _Type_ARRAY *this_local;
  
  local_28 = in_RCX;
  obj2_local = obj2;
  obj1_local = obj1;
  this_local = this;
  pOVar2 = Variable::operator->(in_RCX);
  pTVar3 = Object::GetType(pOVar2);
  bVar1 = Type::operator==(pTVar3,(Type *)_type_number);
  if (bVar1) {
    pOVar2 = Variable::operator->(obj2_local);
    pAVar4 = Object::GetData<LiteScript::Array>(pOVar2);
    pOVar2 = Variable::operator->(local_28);
    this_00 = Object::GetData<LiteScript::Number>(pOVar2);
    Number::operator_cast_to_int(this_00);
    VVar6 = Array::operator[]((Array *)this,(uint)pAVar4);
    puVar5 = VVar6.nb_ref;
  }
  else {
    pOVar2 = Variable::operator->(local_28);
    pTVar3 = Object::GetType(pOVar2);
    bVar1 = Type::operator==(pTVar3,(Type *)_type_string);
    if (bVar1) {
      pOVar2 = Variable::operator->(obj2_local);
      pAVar4 = Object::GetData<LiteScript::Array>(pOVar2);
      pOVar2 = Variable::operator->(local_28);
      Object::GetData<LiteScript::String>(pOVar2);
      String::operator_cast_to_string(&local_48);
      std::__cxx11::string::c_str();
      Array::operator[]((Array *)this,(char *)pAVar4);
      std::__cxx11::string::~string((string *)&local_48);
      puVar5 = extraout_RDX;
    }
    else {
      pOVar2 = Variable::operator->(obj2_local);
      VVar6 = Memory::Create((Memory *)this,(Type *)pOVar2->memory);
      puVar5 = VVar6.nb_ref;
    }
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_ARRAY::OArray(Variable &obj1, const Variable &obj2) const {
    if (obj2->GetType() == Type::NUMBER)
        return obj1->GetData<Array>()[(unsigned int)(int)obj2->GetData<Number>()];
    else if (obj2->GetType() == Type::STRING)
        return obj1->GetData<Array>()[((std::string)(obj2->GetData<String>())).c_str()];
    else
        return obj1->memory.Create(Type::UNDEFINED);
}